

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Connection::exchange_data(Connection *this,fd_set *rdfds,fd_set *wrfds)

{
  int iVar1;
  reference pvVar2;
  ssize_t sVar3;
  int *piVar4;
  ssize_t res_1;
  ssize_t res;
  fd_set *wrfds_local;
  fd_set *rdfds_local;
  Connection *this_local;
  
  if ((this->data_c_f_ == 0) &&
     ((rdfds->fds_bits[this->client_socket_ / 0x40] &
      1L << ((byte)((long)this->client_socket_ % 0x40) & 0x3f)) != 0)) {
    iVar1 = this->client_socket_;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buf_cf_,0);
    sVar3 = recv(iVar1,pvVar2,this->kBufSize,0);
    this->data_c_f_ = sVar3;
    if ((this->data_c_f_ == 0) ||
       ((this->data_c_f_ == -1 && (piVar4 = __errno_location(), *piVar4 != 0xb)))) {
      this->active_ = false;
    }
    if ((this->data_c_f_ == -1) && (piVar4 = __errno_location(), *piVar4 == 0xb)) {
      this->data_c_f_ = 0;
    }
  }
  if ((this->data_f_c_ == 0) &&
     ((rdfds->fds_bits[this->forwarding_socket_ / 0x40] &
      1L << ((byte)((long)this->forwarding_socket_ % 0x40) & 0x3f)) != 0)) {
    iVar1 = this->forwarding_socket_;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buf_fc_,0);
    sVar3 = recv(iVar1,pvVar2,this->kBufSize,0);
    this->data_f_c_ = sVar3;
    if ((this->data_f_c_ == 0) ||
       ((this->data_f_c_ == -1 && (piVar4 = __errno_location(), *piVar4 != 0xb)))) {
      this->active_ = false;
    }
    if ((this->data_f_c_ == -1) && (piVar4 = __errno_location(), *piVar4 == 0xb)) {
      this->data_f_c_ = 0;
    }
  }
  if ((0 < this->data_c_f_) &&
     ((wrfds->fds_bits[this->forwarding_socket_ / 0x40] &
      1L << ((byte)((long)this->forwarding_socket_ % 0x40) & 0x3f)) != 0)) {
    iVar1 = this->forwarding_socket_;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buf_cf_,0);
    sVar3 = send(iVar1,pvVar2,this->data_c_f_,0);
    if (sVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0xb) {
        this->active_ = false;
      }
    }
    else {
      this->data_c_f_ = 0;
    }
  }
  if ((0 < this->data_f_c_) &&
     ((wrfds->fds_bits[this->client_socket_ / 0x40] &
      1L << ((byte)((long)this->client_socket_ % 0x40) & 0x3f)) != 0)) {
    iVar1 = this->client_socket_;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->buf_fc_,0);
    sVar3 = send(iVar1,pvVar2,this->data_f_c_,0);
    if (sVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0xb) {
        this->active_ = false;
      }
    }
    else {
      this->data_f_c_ = 0;
    }
  }
  return;
}

Assistant:

void Connection::exchange_data(const fd_set &rdfds, const fd_set &wrfds) {
    if (data_c_f_ == 0 && FD_ISSET(client_socket_, &rdfds)) {
        data_c_f_ = ::recv(client_socket_, &buf_cf_[0], kBufSize, 0);
        if (data_c_f_ == 0 || (data_c_f_ == -1 && errno != EWOULDBLOCK)) {
            active_ = false;
        }
        if (data_c_f_ == -1 && errno == EWOULDBLOCK) {
            data_c_f_ = 0;
        }
    }
    if (data_f_c_ == 0 && FD_ISSET(forwarding_socket_, &rdfds)) {
        data_f_c_ = ::recv(forwarding_socket_, &buf_fc_[0], kBufSize, 0);
        if (data_f_c_ == 0 || (data_f_c_ == -1 && errno != EWOULDBLOCK)) {
            active_ = false;
        }
        if (data_f_c_ == -1 && errno == EWOULDBLOCK) {
            data_f_c_ = 0;
        }
    }
    if (data_c_f_ > 0 && FD_ISSET(forwarding_socket_, &wrfds)) {
        ssize_t res = send(forwarding_socket_, &buf_cf_[0], data_c_f_, 0);
        if (res == -1) {
            if (errno != EWOULDBLOCK) {
                active_ = false;
            }
        } else data_c_f_ = 0;
    }
    if (data_f_c_ > 0 && FD_ISSET(client_socket_, &wrfds)) {
        ssize_t res = send(client_socket_, &buf_fc_[0], data_f_c_, 0);
        if (res == -1) {
            if (errno != EWOULDBLOCK) {
                active_ = false;
            }
        } else data_f_c_ = 0;
    }

}